

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

index_t GEO::BalancedKdTree::max_node_index(index_t node_id,index_t b,index_t e)

{
  uint *puVar1;
  index_t local_24;
  index_t local_20;
  index_t local_1c;
  index_t local_18;
  index_t m;
  index_t e_local;
  index_t b_local;
  index_t node_id_local;
  
  b_local = node_id;
  if (0x10 < e - b) {
    local_1c = b + (e - b >> 1);
    local_18 = e;
    m = b;
    e_local = node_id;
    local_20 = max_node_index(node_id << 1,b,local_1c);
    local_24 = max_node_index(e_local * 2 + 1,local_1c,local_18);
    puVar1 = std::max<unsigned_int>(&local_20,&local_24);
    b_local = *puVar1;
  }
  return b_local;
}

Assistant:

static index_t max_node_index(
            index_t node_id, index_t b, index_t e
        ) {
            if(e - b <= MAX_LEAF_SIZE) {
                return node_id;
            }
            index_t m = b + (e - b) / 2;
            return std::max(
                max_node_index(2 * node_id, b, m),
                max_node_index(2 * node_id + 1, m, e)
            );
        }